

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O2

void presolve::dev_kkt_check::checkStationarityOfLagrangian
               (State *state,KktConditionDetails *details)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  int j;
  long lVar5;
  double dVar6;
  double dVar7;
  HighsCDouble HVar8;
  HighsCDouble local_58;
  double *local_48;
  HighsCDouble local_40;
  
  details->type = kStationarityOfLagrangian;
  local_48 = &details->max_violation;
  details->checked = 0;
  details->violated = 0;
  details->max_violation = 0.0;
  details->sum_violation_2 = 0.0;
  for (lVar5 = 0; lVar5 < state->numCol; lVar5 = lVar5 + 1) {
    if ((state->flagCol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar5] != 0) {
      details->checked = details->checked + 1;
      local_40.hi = (state->colCost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar5];
      local_40.lo = 0.0;
      HVar8 = HighsCDouble::operator-
                        (&local_40,
                         (state->colDual->super__Vector_base<double,_std::allocator<double>_>).
                         _M_impl.super__Vector_impl_data._M_start[lVar5]);
      lVar3 = (long)(state->Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar5];
      local_58 = HVar8;
      while( true ) {
        if ((state->Aend->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar5] <= lVar3) break;
        iVar1 = (state->Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar3];
        if ((state->flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar1] != 0) {
          HVar8 = HighsCDouble::operator-
                            (&local_58,
                             (state->rowDual->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data._M_start[iVar1] *
                             (state->Avalue->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data._M_start[lVar3]);
          local_58 = HVar8;
        }
        lVar3 = lVar3 + 1;
      }
      if (1e-07 < ABS(HVar8.hi + HVar8.lo)) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Column ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar5);
        poVar2 = std::operator<<(poVar2," fails stationary of Lagrangian: dL/dx");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar5);
        std::operator<<(poVar2," = ");
        poVar2 = std::ostream::_M_insert<double>(local_58.hi + local_58.lo);
        poVar2 = std::operator<<(poVar2,", rather than zero.");
        std::endl<char,std::char_traits<char>>(poVar2);
        dVar6 = local_58.hi + local_58.lo;
        if (dVar6 != 0.0) {
          details->violated = details->violated + 1;
          dVar7 = ABS(dVar6);
          details->sum_violation_2 = dVar6 * dVar6 + details->sum_violation_2;
          if (details->max_violation <= dVar7 && dVar7 != details->max_violation) {
            *local_48 = dVar7;
          }
        }
      }
    }
  }
  pcVar4 = "KKT check error: Lagrangian is not stationary.\n";
  if (details->violated == 0) {
    pcVar4 = "Stationarity of Lagrangian.\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar4);
  return;
}

Assistant:

void checkStationarityOfLagrangian(const State& state,
                                   KktConditionDetails& details) {
  details.type = KktCondition::kStationarityOfLagrangian;
  details.checked = 0;
  details.violated = 0;
  details.max_violation = 0.0;
  details.sum_violation_2 = 0.0;

  // A'y + c - z = 0
  for (int j = 0; j < state.numCol; j++) {
    if (state.flagCol[j]) {
      details.checked++;
      double infeas = 0;

      HighsCDouble lagrV = HighsCDouble(state.colCost[j]) - state.colDual[j];
      for (int k = state.Astart[j]; k < state.Aend[j]; k++) {
        const int row = state.Aindex[k];
        assert(row >= 0 && row < state.numRow);
        if (state.flagRow[row])
          lagrV = lagrV - state.rowDual[row] * state.Avalue[k];
      }

      if (fabs(double(lagrV)) > tol) {
        if (dev_print == 1)
          std::cout << "Column " << j
                    << " fails stationary of Lagrangian: dL/dx" << j << " = "
                    << double(lagrV) << ", rather than zero." << std::endl;
        infeas = fabs(double(lagrV));
      }

      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  if (details.violated == 0) {
    if (dev_print == 1) std::cout << "Stationarity of Lagrangian.\n";
  } else {
    if (dev_print == 1)
      std::cout << "KKT check error: Lagrangian is not stationary.\n";
  }
}